

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_alignment
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  mapped_type *pmVar5;
  SPIRType *type_00;
  CompilerError *this_00;
  BufferPackingStandard extraout_EDX;
  uint uVar6;
  CompilerGLSL *this_01;
  uint uVar7;
  ulong uVar8;
  Bitset local_70;
  
  uVar6 = 0;
  do {
    bVar2 = Compiler::is_physical_pointer(&this->super_Compiler,type);
    if (bVar2) {
      if (type->pointer == false) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Types in PhysicalStorageBufferEXT must be pointers.");
      }
      else {
        if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
          if (((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) &&
             (bVar2 = Compiler::type_is_array_of_pointers(&this->super_Compiler,type), bVar2)) {
            uVar4 = 0x10;
          }
          else {
            uVar4 = 8;
          }
LAB_00226d4e:
          if (uVar6 < uVar4) {
            uVar6 = uVar4;
          }
          return uVar6;
        }
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
                  );
      }
LAB_00226e2d:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01 = this;
    bVar2 = Compiler::is_array(&this->super_Compiler,type);
    if (!bVar2) {
      if (type->basetype == Struct) {
        uVar4 = 1;
        for (uVar7 = 0; uVar8 = (ulong)uVar7,
            uVar8 < (type->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
            uVar7 = uVar7 + 1) {
          pmVar5 = ::std::__detail::
                   _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
          Bitset::Bitset(&local_70,
                         &(pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr
                          [uVar8].decoration_flags);
          type_00 = Compiler::get<spirv_cross::SPIRType>
                              (&this->super_Compiler,
                               (type->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                               [uVar8].id);
          uVar3 = type_to_packed_alignment(this,type_00,&local_70,packing);
          if (uVar4 <= uVar3) {
            uVar4 = uVar3;
          }
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_70.higher._M_h);
        }
        if (((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) &&
           (uVar4 < 0x11)) {
          uVar4 = 0x10;
        }
        goto LAB_00226d4e;
      }
      uVar4 = type_to_packed_base_size(this_01,type,extraout_EDX);
      if ((packing & ~BufferPackingStd430) == BufferPackingScalar) goto LAB_00226d4e;
      uVar7 = type->columns;
      if (uVar7 == 1) {
        if (((packing & ~BufferPackingStd430) == BufferPackingHLSLCbuffer) ||
           (uVar1 = type->vecsize, uVar1 == 1)) goto LAB_00226d4e;
      }
      else {
        uVar1 = type->vecsize;
      }
      if ((uVar1 == 4) || (uVar1 == 2)) {
        if (uVar7 != 1) goto LAB_00226d9b;
LAB_00226d79:
        uVar4 = uVar4 * uVar1;
        goto LAB_00226d4e;
      }
      if (uVar1 != 3 || uVar7 != 1) {
LAB_00226d9b:
        if (uVar7 < 2 || (flags->lower & 0x20) == 0) {
          if ((uVar1 < 2) || ((flags->lower & 0x10) == 0)) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (this_00,"Did not find suitable rule for type. Bogus decorations?");
            goto LAB_00226e2d;
          }
          if (((BufferPackingHLSLCbufferPackOffset < packing) ||
              ((0x35U >> (packing & 0x1f) & 1) == 0)) && (uVar7 != 3)) {
            uVar4 = uVar4 * uVar7;
            goto LAB_00226d4e;
          }
        }
        else if (((BufferPackingHLSLCbufferPackOffset < packing) ||
                 ((0x35U >> (packing & 0x1f) & 1) == 0)) && (uVar1 != 3)) goto LAB_00226d79;
      }
      uVar4 = uVar4 << 2;
      goto LAB_00226d4e;
    }
    uVar4 = 1;
    if (packing < BufferPackingScalar) {
      uVar4 = *(uint *)(&DAT_002c40c4 + (ulong)packing * 4);
    }
    do {
      type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->parent_type).id);
    } while ((type->array).super_VectorView<unsigned_int>.buffer_size != 0);
    if (uVar6 < uVar4) {
      uVar6 = uVar4;
    }
  } while( true );
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_alignment(const SPIRType &type, const Bitset &flags,
                                                BufferPackingStandard packing)
{
	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (is_physical_pointer(type))
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
		{
			if (packing_is_vec4_padded(packing) && type_is_array_of_pointers(type))
				return 16;
			else
				return 8;
		}
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}
	else if (is_array(type))
	{
		uint32_t minimum_alignment = 1;
		if (packing_is_vec4_padded(packing))
			minimum_alignment = 16;

		auto *tmp = &get<SPIRType>(type.parent_type);
		while (!tmp->array.empty())
			tmp = &get<SPIRType>(tmp->parent_type);

		// Get the alignment of the base type, then maybe round up.
		return max(minimum_alignment, type_to_packed_alignment(*tmp, flags, packing));
	}

	if (type.basetype == SPIRType::Struct)
	{
		// Rule 9. Structs alignments are maximum alignment of its members.
		uint32_t alignment = 1;
		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			alignment =
			    max(alignment, type_to_packed_alignment(get<SPIRType>(type.member_types[i]), member_flags, packing));
		}

		// In std140, struct alignment is rounded up to 16.
		if (packing_is_vec4_padded(packing))
			alignment = max<uint32_t>(alignment, 16u);

		return alignment;
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		// Alignment requirement for scalar block layout is always the alignment for the most basic component.
		if (packing_is_scalar(packing))
			return base_alignment;

		// Vectors are *not* aligned in HLSL, but there's an extra rule where vectors cannot straddle
		// a vec4, this is handled outside since that part knows our current offset.
		if (type.columns == 1 && packing_is_hlsl(packing))
			return base_alignment;

		// From 7.6.2.2 in GL 4.5 core spec.
		// Rule 1
		if (type.vecsize == 1 && type.columns == 1)
			return base_alignment;

		// Rule 2
		if ((type.vecsize == 2 || type.vecsize == 4) && type.columns == 1)
			return type.vecsize * base_alignment;

		// Rule 3
		if (type.vecsize == 3 && type.columns == 1)
			return 4 * base_alignment;

		// Rule 4 implied. Alignment does not change in std430.

		// Rule 5. Column-major matrices are stored as arrays of
		// vectors.
		if (flags.get(DecorationColMajor) && type.columns > 1)
		{
			if (packing_is_vec4_padded(packing))
				return 4 * base_alignment;
			else if (type.vecsize == 3)
				return 4 * base_alignment;
			else
				return type.vecsize * base_alignment;
		}

		// Rule 6 implied.

		// Rule 7.
		if (flags.get(DecorationRowMajor) && type.vecsize > 1)
		{
			if (packing_is_vec4_padded(packing))
				return 4 * base_alignment;
			else if (type.columns == 3)
				return 4 * base_alignment;
			else
				return type.columns * base_alignment;
		}

		// Rule 8 implied.
	}

	SPIRV_CROSS_THROW("Did not find suitable rule for type. Bogus decorations?");
}